

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inst.h
# Opt level: O2

void __thiscall mocker::nasm::Call::~Call(Call *this)

{
  (this->super_Inst)._vptr_Inst = (_func_int **)&PTR__Call_001f0818;
  std::__cxx11::string::~string((string *)&this->funcName);
  return;
}

Assistant:

explicit Call(std::string funcName) : funcName(std::move(funcName)) {}